

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParser.cpp
# Opt level: O1

char * ODDLParser::OpenDDLParser::parseDataList
                 (char *in,char *end,ValueType type,Value **data,size_t *numValues,Reference **refs,
                 size_t *numRefs)

{
  byte bVar1;
  pointer names_00;
  pointer ppNVar2;
  uint uVar3;
  byte *pbVar4;
  byte *in_00;
  Reference *this;
  byte *pbVar5;
  ValueType floatType;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  bool bVar9;
  vector<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_> names;
  Value *local_80;
  vector<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_> local_78;
  Value *local_60;
  Reference **local_58;
  ulong local_50;
  ulong local_48;
  Value **local_40;
  size_t *local_38;
  
  uVar6 = (ulong)(uint)type;
  *data = (Value *)0x0;
  *numRefs = 0;
  *numValues = 0;
  pbVar4 = (byte *)in;
  if (in != end && in != (char *)0x0) {
    do {
      in = (char *)pbVar4;
      if ((0x2c < (ulong)(byte)*in) || ((0x100100002600U >> ((ulong)(byte)*in & 0x3f) & 1) == 0))
      break;
      pbVar4 = (byte *)in + 1;
      in = end;
    } while (pbVar4 != (byte *)end);
    if (*in == 0x7b) {
      pbVar4 = (byte *)in + 1;
      if (((byte *)in)[1] != 0x7d) {
        local_60 = (Value *)0x0;
        uVar7 = (ulong)(uint)(type + ddl_int8);
        local_58 = refs;
        local_50 = uVar7;
        local_48 = uVar6;
        local_40 = data;
        local_38 = numValues;
LAB_0068556b:
        local_80 = (Value *)0x0;
        in_00 = pbVar4;
        while (((pbVar4 != (byte *)end && (in_00 = pbVar4, (ulong)*pbVar4 < 0x2d)) &&
               ((0x100100002600U >> ((ulong)*pbVar4 & 0x3f) & 1) != 0))) {
          pbVar4 = pbVar4 + 1;
          in_00 = (byte *)end;
        }
        if (0xe < (uint)uVar7) goto switchD_006855ab_caseD_68588a;
        floatType = (ValueType)uVar6;
        switch((long)&switchD_006855ab::switchdataD_0070edec +
               (long)(int)(&switchD_006855ab::switchdataD_0070edec)[uVar7]) {
        case 0x6855ad:
LAB_006855b7:
          in_00 = (byte *)parseIntegerLiteral((char *)in_00,end,&local_80,floatType);
          break;
        case 0x6855c1:
LAB_006855cb:
          in_00 = (byte *)parseFloatingLiteral((char *)in_00,end,&local_80,floatType);
          break;
        case 0x6855d5:
          pbVar4 = in_00;
          if (in_00 != (byte *)end) {
            pbVar4 = in_00 + (*in_00 == 0x2d);
          }
          bVar9 = false;
          do {
            bVar8 = bVar9;
            bVar1 = *pbVar4;
            if ((((ulong)bVar1 < 0x2d) && ((0x100100000200U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) ||
               ((bVar1 == 0x7d || ((pbVar4 == (byte *)end || (bVar1 == 0x29)))))) break;
            pbVar4 = pbVar4 + 1;
            bVar8 = (byte)(bVar1 - 0x30) < 10;
            bVar9 = true;
          } while (bVar8);
          if (bVar8) {
            floatType = ddl_int32;
            goto LAB_006855b7;
          }
          pbVar4 = in_00;
          if (in_00 != (byte *)end) {
            pbVar4 = in_00 + (*in_00 == 0x2d);
          }
          bVar9 = false;
          pbVar5 = pbVar4;
          while( true ) {
            pbVar5 = pbVar5 + 1;
            bVar1 = *pbVar4;
            if (((((ulong)bVar1 < 0x2d) && ((0x100100000200U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) ||
                (bVar1 == 0x7d)) || ((pbVar4 == (byte *)end || (bVar1 == 0x29)))) break;
            if (bVar1 == 0x2e) {
              bVar9 = true;
              break;
            }
            if (9 < (byte)(bVar1 - 0x30)) goto LAB_00685796;
            pbVar4 = pbVar4 + 1;
            bVar9 = true;
          }
          if (bVar1 == 0x2e) goto LAB_00685747;
          goto LAB_00685796;
        case 0x68563a:
          local_78.super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>.
          _M_impl.super__Vector_impl_data._M_start = (Name **)0x0;
          local_78.super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>.
          _M_impl.super__Vector_impl_data._M_finish = (Name **)0x0;
          local_78.super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          in_00 = (byte *)parseReference((char *)in_00,end,&local_78);
          ppNVar2 = local_78.
                    super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          names_00 = local_78.
                     super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          if (local_78.super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>.
              _M_impl.super__Vector_impl_data._M_start !=
              local_78.super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            this = (Reference *)operator_new(0x10);
            Reference::Reference(this,(long)ppNVar2 - (long)names_00 >> 3,names_00);
            *local_58 = this;
            *numRefs = (long)local_78.
                             super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_78.
                             super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3;
          }
          uVar6 = local_48;
          uVar7 = local_50;
          if (local_78.super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>.
              _M_impl.super__Vector_impl_data._M_start != (Name **)0x0) {
            operator_delete(local_78.
                            super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
            uVar7 = local_50;
          }
          break;
        case 0x6857ab:
          goto switchD_006855ab_caseD_6857ab;
        case 0x68588a:
          goto switchD_006855ab_caseD_68588a;
        }
        goto LAB_006857bb;
      }
LAB_006858aa:
      in = (char *)(pbVar4 + 1);
    }
  }
  return in;
  while( true ) {
    pbVar5 = pbVar5 + 1;
    bVar9 = (byte)(bVar1 - 0x30) < 10;
    if (!bVar9) break;
LAB_00685747:
    bVar1 = *pbVar5;
    if ((((ulong)bVar1 < 0x2d) && ((0x100100000200U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) ||
       ((bVar1 == 0x7d || ((pbVar5 == (byte *)end || (bVar1 == 0x29)))))) {
      if (bVar9) {
        floatType = ddl_float;
        goto LAB_006855cb;
      }
      break;
    }
  }
LAB_00685796:
  if (*in_00 == 0x30) {
    if ((in_00 + 1 != (byte *)end) && ((in_00[1] + 0xa8 & 0xdf) == 0)) {
      in_00 = (byte *)parseHexaLiteral((char *)in_00,end,&local_80);
      goto LAB_006857bb;
    }
  }
  else if (*in_00 == 0x22) {
switchD_006855ab_caseD_6857ab:
    in_00 = (byte *)parseStringLiteral((char *)in_00,end,&local_80);
    goto LAB_006857bb;
  }
switchD_006855ab_caseD_68588a:
LAB_006857bb:
  if (local_80 != (Value *)0x0) {
    if (*local_40 == (Value *)0x0) {
      *local_40 = local_80;
    }
    else {
      Value::setNext(local_60,local_80);
    }
    local_60 = local_80;
    *local_38 = *local_38 + 1;
  }
  do {
    do {
      pbVar4 = in_00;
      bVar1 = *pbVar4;
      uVar3 = (uint)bVar1;
      in_00 = pbVar4 + 1;
    } while (pbVar4 == (byte *)end);
  } while (((bVar1 & 0xfe) != 0x28 && (bVar1 != 0x5b && bVar1 != 0x7d)) &&
           ((bVar1 != 0x7b && bVar1 != 0x2c) && (bVar1 != 0x20 && bVar1 != 9)));
  if ((((0x2c < uVar3) || ((0x100100000200U >> ((ulong)uVar3 & 0x3f) & 1) == 0)) && (uVar3 != 0x7d))
     || (*pbVar4 == 0x7d)) goto LAB_006858aa;
  goto LAB_0068556b;
}

Assistant:

char *OpenDDLParser::parseDataList( char *in, char *end, Value::ValueType type, Value **data, 
                                    size_t &numValues, Reference **refs, size_t &numRefs ) {
    *data = ddl_nullptr;
    numValues = numRefs = 0;
    if( ddl_nullptr == in || in == end ) {
        return in;
    }

    in = lookForNextToken( in, end );
    if( *in == '{' ) {
        ++in;
        Value *current( ddl_nullptr ), *prev( ddl_nullptr );
        while( '}' != *in ) {
            current = ddl_nullptr;
            in = lookForNextToken( in, end );
            if ( Value::ddl_ref == type ) {
                std::vector<Name*> names;
                in = parseReference( in, end, names );
                if ( !names.empty() ) {
                    Reference *ref = new Reference( names.size(), &names[ 0 ] );
                    *refs = ref;
                    numRefs = names.size();
                }
            } else  if ( Value::ddl_none == type ) {
                if (isInteger( in, end )) {
                    in = parseIntegerLiteral( in, end, &current );
                } else if (isFloat( in, end )) {
                    in = parseFloatingLiteral( in, end, &current );
                } else if (isStringLiteral( *in )) {
                    in = parseStringLiteral( in, end, &current );
                } else if (isHexLiteral( in, end )) {
                    in = parseHexaLiteral( in, end, &current );
                }
            } else {
                switch(type){
                    case Value::ddl_int8:
                    case Value::ddl_int16:
                    case Value::ddl_int32:
                    case Value::ddl_int64:
                    case Value::ddl_unsigned_int8:
                    case Value::ddl_unsigned_int16:
                    case Value::ddl_unsigned_int32:
                    case Value::ddl_unsigned_int64:
                        in = parseIntegerLiteral( in, end, &current, type);
                        break;
                    case Value::ddl_half:
                    case Value::ddl_float:
                    case Value::ddl_double:
                        in = parseFloatingLiteral( in, end, &current, type);
                        break;
                    case Value::ddl_string:
                        in = parseStringLiteral( in, end, &current );
                        break;
                    default:
                        break;
                }
            }

            if( ddl_nullptr != current ) {
                if( ddl_nullptr == *data ) {
                    *data = current;
                    prev = current;
                } else {
                    prev->setNext( current );
                    prev = current;
                }
                ++numValues;
            }

            in = getNextSeparator( in, end );
            if( ',' != *in && Grammar::CloseBracketToken[ 0 ] != *in && !isSpace( *in ) ) {
                break;
            }
        }
        ++in;
    }

    return in;
}